

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_reveal_trap(chunk_conflict2 *c,loc_conflict grid,_Bool always,_Bool domsg)

{
  _Bool _Var1;
  trap *local_30;
  trap *trap;
  wchar_t found_trap;
  _Bool domsg_local;
  _Bool always_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  trap._0_4_ = 0;
  local_30 = square_trap((chunk *)c,grid);
  _Var1 = square_isplayertrap((chunk *)c,grid);
  if (_Var1) {
    while (local_30 != (trap *)0x0) {
      _Var1 = flag_has_dbg(local_30->flags,2,2,"trap->flags","TRF_TRAP");
      if (_Var1) {
        if ((always) || ((int)(uint)local_30->power <= (player->state).skills[4])) {
          _Var1 = flag_has_dbg(local_30->flags,2,3,"trap->flags","TRF_VISIBLE");
          if (!_Var1) {
            flag_on_dbg(local_30->flags,2,3,"trap->flags","TRF_VISIBLE");
            square_memorize_traps(c,grid);
            trap._0_4_ = (uint)trap + 1;
          }
          local_30 = local_30->next;
        }
        else {
          local_30 = local_30->next;
        }
      }
      else {
        local_30 = local_30->next;
      }
    }
    if ((uint)trap != 0) {
      if (domsg) {
        if ((uint)trap == 1) {
          msg("You have found a trap.");
        }
        else {
          msg("You have found %d traps.",(ulong)(uint)trap);
        }
      }
      square_memorize((chunk *)c,grid);
      square_light_spot((chunk *)c,(loc)grid);
    }
    grid_local.x._3_1_ = (uint)trap != 0;
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_reveal_trap(struct chunk *c, struct loc grid, bool always,
						bool domsg)
{
    int found_trap = 0;
	struct trap *trap = square_trap(c, grid);
    
    /* Check there is a player trap */
    if (!square_isplayertrap(c, grid))
		return false;

	/* Scan the grid */
	while (trap) {
		/* Skip non-player traps */
		if (!trf_has(trap->flags, TRF_TRAP)) {
			trap = trap->next;
			continue;
		}
		
		/* Skip traps the player doesn't notice */
		if (!always && player->state.skills[SKILL_SEARCH] < trap->power) {
			trap = trap->next;
			continue;
		}

		/* Trap is invisible */
		if (!trf_has(trap->flags, TRF_VISIBLE)) {
			/* See the trap (actually, see all the traps) */
			trf_on(trap->flags, TRF_VISIBLE);
			square_memorize_traps(c, grid);

			/* We found a trap */
			found_trap++;
		}
		trap = trap->next;
	}

    /* We found at least one trap */
    if (found_trap) {
		/* We want to talk about it */
		if (domsg) {
			if (found_trap == 1)
				msg("You have found a trap.");
			else
				msg("You have found %d traps.", found_trap);
		}

		/* Memorize */
		square_memorize(c, grid);

		/* Redraw */
		square_light_spot(c, grid);
    }

    /* Return true if we found any traps */
    return (found_trap != 0);
}